

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O1

QTransform * __thiscall
QTransform::inverted(QTransform *__return_storage_ptr__,QTransform *this,bool *invertible)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  qreal qVar9;
  TransformationType TVar10;
  long lVar11;
  bool bVar12;
  qreal *pqVar13;
  qreal *pqVar14;
  long in_FS_OFFSET;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  ushort local_40;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar13 = (qreal *)&DAT_006b3250;
  pqVar14 = (qreal *)__return_storage_ptr__;
  for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
    *pqVar14 = *pqVar13;
    pqVar13 = pqVar13 + 1;
    pqVar14 = pqVar14 + 1;
  }
  pqVar13 = (qreal *)&DAT_006b32a0;
  pqVar14 = (qreal *)__return_storage_ptr__;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    *pqVar14 = *pqVar13;
    pqVar13 = pqVar13 + 1;
    pqVar14 = pqVar14 + 1;
  }
  *(ushort *)&__return_storage_ptr__->field_0x48 =
       *(ushort *)&__return_storage_ptr__->field_0x48 & 0xfc00;
  if ((*(ushort *)&this->field_0x48 & 0x3e0) == 0) {
    TVar10 = *(ushort *)&this->field_0x48 & (TxProject|TxShear|TxRotate|TxScale|TxTranslate);
  }
  else {
    TVar10 = type(this);
  }
  bVar12 = true;
  if (TVar10 != TxNone) {
    if (TVar10 == TxScale) {
      dVar18 = this->m_matrix[0][0];
      dVar1 = this->m_matrix[1][1];
      uVar16 = -(ulong)(dVar18 < -dVar18);
      uVar15 = -(ulong)(dVar1 < -dVar1);
      bVar7 = 1e-12 < (double)(~uVar15 & (ulong)dVar1 | (ulong)-dVar1 & uVar15);
      bVar8 = 1e-12 < (double)(~uVar16 & (ulong)dVar18 | (ulong)-dVar18 & uVar16);
      bVar12 = bVar7 && bVar8;
      if (bVar7 && bVar8) {
        auVar17._8_8_ = dVar1;
        auVar17._0_8_ = dVar18;
        auVar17 = divpd(_DAT_00688fc0,auVar17);
        __return_storage_ptr__->m_matrix[0][0] = auVar17._0_8_;
        __return_storage_ptr__->m_matrix[1][1] = auVar17._8_8_;
        dVar18 = this->m_matrix[2][1];
        __return_storage_ptr__->m_matrix[2][0] = -this->m_matrix[2][0] * auVar17._0_8_;
        __return_storage_ptr__->m_matrix[2][1] = -dVar18 * auVar17._8_8_;
      }
    }
    else if (TVar10 == TxTranslate) {
      qVar9 = this->m_matrix[2][1];
      __return_storage_ptr__->m_matrix[2][0] = -this->m_matrix[2][0];
      __return_storage_ptr__->m_matrix[2][1] = -qVar9;
    }
    else {
      dVar18 = this->m_matrix[2][2];
      dVar1 = this->m_matrix[1][1];
      dVar2 = this->m_matrix[2][1];
      dVar3 = this->m_matrix[1][2];
      dVar4 = this->m_matrix[0][1];
      dVar5 = this->m_matrix[0][2];
      dVar18 = (dVar3 * dVar4 - dVar5 * dVar1) * this->m_matrix[2][0] +
               ((dVar18 * dVar1 - dVar3 * dVar2) * this->m_matrix[0][0] -
               (dVar18 * dVar4 - dVar2 * dVar5) * this->m_matrix[1][0]);
      uVar16 = -(ulong)(dVar18 < -dVar18);
      bVar12 = 1e-12 < (double)(~uVar16 & (ulong)dVar18 | (ulong)-dVar18 & uVar16);
      if (bVar12) {
        adjoint(this);
        if ((dVar18 != 0.0) || (NAN(dVar18))) {
          dVar18 = 1.0 / dVar18;
          if ((dVar18 != 1.0) || (NAN(dVar18))) {
            local_88 = local_88 * dVar18;
            dStack_80 = dStack_80 * dVar18;
            local_78 = local_78 * dVar18;
            dStack_70 = dStack_70 * dVar18;
            local_68 = local_68 * dVar18;
            dStack_60 = dStack_60 * dVar18;
            local_58 = dVar18 * local_58;
            dStack_50 = dVar18 * dStack_50;
            local_48 = local_48 * dVar18;
            if ((local_40 & 0x3c0) == 0) {
              local_40 = local_40 & 0xfc1f | 0x40;
            }
          }
        }
        __return_storage_ptr__->m_matrix[0][0] = local_88;
        __return_storage_ptr__->m_matrix[0][1] = dStack_80;
        __return_storage_ptr__->m_matrix[0][2] = local_78;
        __return_storage_ptr__->m_matrix[1][0] = dStack_70;
        __return_storage_ptr__->m_matrix[1][1] = local_68;
        __return_storage_ptr__->m_matrix[1][2] = dStack_60;
        __return_storage_ptr__->m_matrix[2][0] = local_58;
        __return_storage_ptr__->m_matrix[2][1] = dStack_50;
        __return_storage_ptr__->m_matrix[2][2] = local_48;
        *(ushort *)&__return_storage_ptr__->field_0x48 = local_40;
      }
    }
  }
  if (invertible != (bool *)0x0) {
    *invertible = bVar12;
  }
  if (bVar12 != false) {
    *(ushort *)&__return_storage_ptr__->field_0x48 =
         *(ushort *)&this->field_0x48 & 0x3ff |
         (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x48 & 0xfc00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTransform QTransform::inverted(bool *invertible) const
{
    QTransform invert;
    bool inv = true;

    switch(inline_type()) {
    case TxNone:
        break;
    case TxTranslate:
        invert.m_matrix[2][0] = -m_matrix[2][0];
        invert.m_matrix[2][1] = -m_matrix[2][1];
        break;
    case TxScale:
        inv = !qFuzzyIsNull(m_matrix[0][0]);
        inv &= !qFuzzyIsNull(m_matrix[1][1]);
        if (inv) {
            invert.m_matrix[0][0] = 1. / m_matrix[0][0];
            invert.m_matrix[1][1] = 1. / m_matrix[1][1];
            invert.m_matrix[2][0] = -m_matrix[2][0] * invert.m_matrix[0][0];
            invert.m_matrix[2][1] = -m_matrix[2][1] * invert.m_matrix[1][1];
        }
        break;
    default:
        // general case
        qreal det = determinant();
        inv = !qFuzzyIsNull(det);
        if (inv)
            invert = adjoint() / det;
        break;
    }

    if (invertible)
        *invertible = inv;

    if (inv) {
        // inverting doesn't change the type
        invert.m_type = m_type;
        invert.m_dirty = m_dirty;
    }

    return invert;
}